

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ratectrl.c
# Opt level: O1

int av1_rc_drop_frame(AV1_COMP *cpi)

{
  int *piVar1;
  int iVar2;
  AV1_PRIMARY *pAVar3;
  int64_t buffer_level;
  undefined1 auVar4 [16];
  _Bool _Var5;
  int iVar6;
  long lVar7;
  
  if ((cpi->common).current_frame.frame_type == '\0') {
    return 0;
  }
  pAVar3 = cpi->ppi;
  buffer_level = (pAVar3->p_rc).buffer_level;
  if ((pAVar3->use_svc != 0) &&
     ((cpi->svc).layer_context[(cpi->svc).temporal_layer_id].is_key_frame != 0)) {
    return 0;
  }
  lVar7 = (long)(cpi->oxcf).rc_cfg.drop_frames_water_mark;
  if (lVar7 == 0) {
    return 0;
  }
  iVar6 = (cpi->rc).max_consec_drop;
  if ((0 < iVar6) && (iVar6 <= (cpi->rc).drop_count_consec)) {
    return 0;
  }
  if ((((pAVar3->use_svc != 0) && (iVar6 = (cpi->svc).spatial_layer_id, 0 < iVar6)) &&
      ((cpi->svc).drop_spatial_layer[iVar6 - 1] == true)) &&
     ((cpi->svc).framedrop_mode == AOM_FULL_SUPERFRAME_DROP)) {
    return 1;
  }
  _Var5 = check_buffer_below_thresh(cpi,buffer_level,-1);
  if (_Var5) {
LAB_00200c1b:
    piVar1 = &(cpi->rc).drop_count_consec;
    *piVar1 = *piVar1 + 1;
    iVar6 = 1;
  }
  else {
    auVar4 = SEXT816(lVar7 * (pAVar3->p_rc).optimal_buffer_level) * ZEXT816(0xa3d70a3d70a3d70b);
    _Var5 = check_buffer_below_thresh
                      (cpi,buffer_level,(int)(auVar4._8_8_ >> 6) - (auVar4._12_4_ >> 0x1f));
    if (_Var5) {
LAB_00200bd2:
      if ((cpi->rc).decimation_factor == 0) {
        (cpi->rc).decimation_factor = 1;
      }
    }
    else {
      iVar6 = (cpi->rc).decimation_factor;
      if (iVar6 < 1) {
        if (_Var5) goto LAB_00200bd2;
      }
      else {
        (cpi->rc).decimation_factor = iVar6 + -1;
      }
    }
    iVar6 = (cpi->rc).decimation_factor;
    if (iVar6 < 1) {
      (cpi->rc).decimation_count = 0;
    }
    else {
      iVar2 = (cpi->rc).decimation_count;
      if (0 < iVar2) {
        (cpi->rc).decimation_count = iVar2 + -1;
        goto LAB_00200c1b;
      }
      (cpi->rc).decimation_count = iVar6;
    }
    iVar6 = 0;
  }
  return iVar6;
}

Assistant:

int av1_rc_drop_frame(AV1_COMP *cpi) {
  const AV1EncoderConfig *oxcf = &cpi->oxcf;
  RATE_CONTROL *const rc = &cpi->rc;
  PRIMARY_RATE_CONTROL *const p_rc = &cpi->ppi->p_rc;
#if CONFIG_FPMT_TEST
  const int simulate_parallel_frame =
      cpi->ppi->gf_group.frame_parallel_level[cpi->gf_frame_index] > 0 &&
      cpi->ppi->fpmt_unit_test_cfg == PARALLEL_SIMULATION_ENCODE;
  int64_t buffer_level =
      simulate_parallel_frame ? p_rc->temp_buffer_level : p_rc->buffer_level;
#else
  int64_t buffer_level = p_rc->buffer_level;
#endif
  // Never drop on key frame, or for frame whose base layer is key.
  // If drop_count_consec hits or exceeds max_consec_drop then don't drop.
  if (cpi->common.current_frame.frame_type == KEY_FRAME ||
      (cpi->ppi->use_svc &&
       cpi->svc.layer_context[cpi->svc.temporal_layer_id].is_key_frame) ||
      !oxcf->rc_cfg.drop_frames_water_mark ||
      (rc->max_consec_drop > 0 &&
       rc->drop_count_consec >= rc->max_consec_drop)) {
    return 0;
  } else {
    SVC *svc = &cpi->svc;
    // In the full_superframe framedrop mode for svc, if the previous spatial
    // layer was dropped, drop the current spatial layer.
    if (cpi->ppi->use_svc && svc->spatial_layer_id > 0 &&
        svc->drop_spatial_layer[svc->spatial_layer_id - 1] &&
        svc->framedrop_mode == AOM_FULL_SUPERFRAME_DROP)
      return 1;
    // -1 is passed here for drop_mark since we are checking if
    // buffer goes below 0 (<= -1).
    if (check_buffer_below_thresh(cpi, buffer_level, -1)) {
      // Always drop if buffer is below 0.
      rc->drop_count_consec++;
      return 1;
    } else {
      // If buffer is below drop_mark, for now just drop every other frame
      // (starting with the next frame) until it increases back over drop_mark.
      const int drop_mark = (int)(oxcf->rc_cfg.drop_frames_water_mark *
                                  p_rc->optimal_buffer_level / 100);
      const bool buffer_below_thresh =
          check_buffer_below_thresh(cpi, buffer_level, drop_mark);
      if (!buffer_below_thresh && rc->decimation_factor > 0) {
        --rc->decimation_factor;
      } else if (buffer_below_thresh && rc->decimation_factor == 0) {
        rc->decimation_factor = 1;
      }
      if (rc->decimation_factor > 0) {
        if (rc->decimation_count > 0) {
          --rc->decimation_count;
          rc->drop_count_consec++;
          return 1;
        } else {
          rc->decimation_count = rc->decimation_factor;
          return 0;
        }
      } else {
        rc->decimation_count = 0;
        return 0;
      }
    }
  }
}